

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

uint * __thiscall
wasm::ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
          (ZeroInitSmallVector<unsigned_int,_1UL> *this,size_t i)

{
  array<unsigned_int,_1UL> *paVar1;
  
  if (((long)(this->super_SmallVector<unsigned_int,_1UL>).flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->super_SmallVector<unsigned_int,_1UL>).flexible.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) +
      (this->super_SmallVector<unsigned_int,_1UL>).usedFixed <= i) {
    resize(this,i + 1);
  }
  paVar1 = (array<unsigned_int,_1UL> *)
           ((this->super_SmallVector<unsigned_int,_1UL>).flexible.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + (i - 1));
  if (i == 0) {
    paVar1 = &(this->super_SmallVector<unsigned_int,_1UL>).fixed;
  }
  return paVar1->_M_elems;
}

Assistant:

T& operator[](size_t i) {
    if (i >= this->size()) {
      resize(i + 1);
    }
    return SmallVector<T, N>::operator[](i);
  }